

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int re_queryrepl(int f,int n)

{
  int iVar1;
  char *pcVar2;
  char local_78 [8];
  char news [80];
  int s;
  int plen;
  int rcnt;
  int n_local;
  int f_local;
  
  s = 0;
  iVar1 = re_readpattern("RE Query replace");
  if (iVar1 != 1) {
    return iVar1;
  }
  pcVar2 = eread("Query replace %s with: ",local_78,0x50,0x58,re_pat);
  if (pcVar2 == (char *)0x0) {
    return 2;
  }
  ewprintf("Query replacing %s with %s:",re_pat,local_78);
LAB_0011bfe5:
  iVar1 = re_forwsrch();
  if (iVar1 == 1) {
    while( true ) {
      update(2);
      iVar1 = getkey(0);
      if (iVar1 == 7) {
        ctrlg(8,0);
        goto LAB_0011c145;
      }
      if (iVar1 == 0x1b) goto LAB_0011c145;
      if (iVar1 == 0x20) break;
      if (iVar1 == 0x21) goto LAB_0011c0e8;
      if (iVar1 == 0x2e) {
        iVar1 = re_doreplace(regex_match[0].rm_eo - regex_match[0].rm_so,local_78);
        if (iVar1 == 0) {
          return 0;
        }
        s = s + 1;
        goto LAB_0011c145;
      }
      if (iVar1 == 0x60) goto LAB_0011c145;
      if (iVar1 == 0x7f) goto LAB_0011bfe5;
      ewprintf("<SP> replace, [.] rep-end, <DEL> don\'t, [!] repl rest <ESC> quit");
    }
    iVar1 = re_doreplace(regex_match[0].rm_eo - regex_match[0].rm_so,local_78);
    if (iVar1 == 0) {
      return 0;
    }
    s = s + 1;
    goto LAB_0011bfe5;
  }
LAB_0011c145:
  curwp->w_rflag = curwp->w_rflag | 8;
  update(2);
  if (inmacro == 0) {
    if (s == 0) {
      ewprintf("(No replacements done)");
    }
    else if (s == 1) {
      ewprintf("(1 replacement done)");
    }
    else {
      ewprintf("(%d replacements done)",(ulong)(uint)s);
    }
  }
  return 1;
LAB_0011c0e8:
  do {
    iVar1 = re_doreplace(regex_match[0].rm_eo - regex_match[0].rm_so,local_78);
    if (iVar1 == 0) {
      return 0;
    }
    s = s + 1;
    iVar1 = re_forwsrch();
  } while (iVar1 == 1);
  goto LAB_0011c145;
}

Assistant:

int
re_queryrepl(int f, int n)
{
	int	rcnt = 0;		/* replacements made so far	*/
	int	plen, s;		/* length of found string	*/
	char	news[NPAT];		/* replacement string		*/

	if ((s = re_readpattern("RE Query replace")) != TRUE)
		return (s);
	if (eread("Query replace %s with: ", news, NPAT,
	    EFNUL | EFNEW | EFCR, re_pat) == NULL)
		return (ABORT);
	ewprintf("Query replacing %s with %s:", re_pat, news);

	/*
	 * Search forward repeatedly, checking each time whether to insert
	 * or not.  The "!" case makes the check always true, so it gets put
	 * into a tighter loop for efficiency.
	 */
	while (re_forwsrch() == TRUE) {
retry:
		update(CMODE);
		switch (getkey(FALSE)) {
		case ' ':
			plen = regex_match[0].rm_eo - regex_match[0].rm_so;
			if (re_doreplace((RSIZE)plen, news) == FALSE)
				return (FALSE);
			rcnt++;
			break;

		case '.':
			plen = regex_match[0].rm_eo - regex_match[0].rm_so;
			if (re_doreplace((RSIZE)plen, news) == FALSE)
				return (FALSE);
			rcnt++;
			goto stopsearch;

		case CCHR('G'):				/* ^G */
			(void)ctrlg(FFRAND, 0);
			goto stopsearch;
		case CCHR('['):				/* ESC */
		case '`':
			goto stopsearch;
		case '!':
			do {
				plen = regex_match[0].rm_eo - regex_match[0].rm_so;
				if (re_doreplace((RSIZE)plen, news) == FALSE)
					return (FALSE);
				rcnt++;
			} while (re_forwsrch() == TRUE);
			goto stopsearch;

		case CCHR('?'):				/* To not replace */
			break;

		default:
			ewprintf("<SP> replace, [.] rep-end, <DEL> don't, [!] repl rest <ESC> quit");
			goto retry;
		}
	}

stopsearch:
	curwp->w_rflag |= WFFULL;
	update(CMODE);
	if (!inmacro) {
		if (rcnt == 0)
			ewprintf("(No replacements done)");
		else if (rcnt == 1)
			ewprintf("(1 replacement done)");
		else
			ewprintf("(%d replacements done)", rcnt);
	}
	return (TRUE);
}